

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_p1363_test.cc
# Opt level: O3

void __thiscall
ECDSAP1363Test_WycheproofP224_Test::TestBody(ECDSAP1363Test_WycheproofP224_Test *this)

{
  RunWycheproofTest("third_party/wycheproof_testvectors/ecdsa_secp224r1_sha224_p1363_test.txt");
  RunWycheproofTest("third_party/wycheproof_testvectors/ecdsa_secp224r1_sha256_p1363_test.txt");
  RunWycheproofTest("third_party/wycheproof_testvectors/ecdsa_secp224r1_sha512_p1363_test.txt");
  return;
}

Assistant:

TEST(ECDSAP1363Test, WycheproofP224) {
  RunWycheproofTest(
      "third_party/wycheproof_testvectors/"
      "ecdsa_secp224r1_sha224_p1363_test.txt");
  RunWycheproofTest(
      "third_party/wycheproof_testvectors/"
      "ecdsa_secp224r1_sha256_p1363_test.txt");
  RunWycheproofTest(
      "third_party/wycheproof_testvectors/"
      "ecdsa_secp224r1_sha512_p1363_test.txt");
}